

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt__GetGlyfOffset(stbtt_fontinfo *info,int glyph_index)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  if ((info->cff).size == 0) {
    iVar3 = -1;
    if ((glyph_index < info->numGlyphs) && (info->indexToLocFormat < 2)) {
      iVar3 = info->loca;
      puVar1 = info->data;
      lVar5 = (long)glyph_index;
      if (info->indexToLocFormat == 0) {
        uVar2 = (uint)puVar1[lVar5 * 2 + (long)iVar3] * 0x200 +
                (uint)puVar1[lVar5 * 2 + (long)iVar3 + 1] * 2;
        uVar4 = (uint)puVar1[lVar5 * 2 + (long)iVar3 + 2] * 0x200 +
                (uint)puVar1[lVar5 * 2 + (long)iVar3 + 3] * 2;
      }
      else {
        uVar2 = *(uint *)(puVar1 + lVar5 * 4 + (long)iVar3);
        uVar4 = *(uint *)(puVar1 + lVar5 * 4 + (long)iVar3 + 4);
        uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
      iVar3 = -1;
      if (uVar2 != uVar4) {
        iVar3 = info->glyf + uVar2;
      }
    }
    return iVar3;
  }
  __assert_fail("!info->cff.size",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imstb_truetype.h"
                ,0x624,"int stbtt__GetGlyfOffset(const stbtt_fontinfo *, int)");
}

Assistant:

static int stbtt__GetGlyfOffset(const stbtt_fontinfo *info, int glyph_index)
{
   int g1,g2;

   STBTT_assert(!info->cff.size);

   if (glyph_index >= info->numGlyphs) return -1; // glyph index out of range
   if (info->indexToLocFormat >= 2)    return -1; // unknown index->glyph map format

   if (info->indexToLocFormat == 0) {
      g1 = info->glyf + ttUSHORT(info->data + info->loca + glyph_index * 2) * 2;
      g2 = info->glyf + ttUSHORT(info->data + info->loca + glyph_index * 2 + 2) * 2;
   } else {
      g1 = info->glyf + ttULONG (info->data + info->loca + glyph_index * 4);
      g2 = info->glyf + ttULONG (info->data + info->loca + glyph_index * 4 + 4);
   }

   return g1==g2 ? -1 : g1; // if length is 0, return -1
}